

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLDoc_free(XMLDoc *doc)

{
  int local_1c;
  int i;
  XMLDoc *doc_local;
  
  if ((doc == (XMLDoc *)0x0) || (doc->init_value != 0x19770522)) {
    doc_local._4_4_ = 0;
  }
  else {
    for (local_1c = 0; local_1c < doc->n_nodes; local_1c = local_1c + 1) {
      XMLNode_free(doc->nodes[local_1c]);
      free(doc->nodes[local_1c]);
    }
    free(doc->nodes);
    doc->nodes = (XMLNode **)0x0;
    doc->n_nodes = 0;
    doc->i_root = -1;
    doc_local._4_4_ = 1;
  }
  return doc_local._4_4_;
}

Assistant:

int XMLDoc_free(XMLDoc* doc)
{
	int i;
	
	if (doc == NULL || doc->init_value != XML_INIT_DONE)
		return FALSE;

	for (i = 0; i < doc->n_nodes; i++) {
		(void)XMLNode_free(doc->nodes[i]);
		__free(doc->nodes[i]);
	}
	__free(doc->nodes);
	doc->nodes = NULL;
	doc->n_nodes = 0;
	doc->i_root = -1;

	return TRUE;
}